

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

void av1_free_above_context_buffers(CommonContexts *above_contexts)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = above_contexts->num_planes;
  if (0 < above_contexts->num_tile_rows) {
    lVar3 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar2 = 0;
        do {
          if (above_contexts->entropy[uVar2] == (ENTROPY_CONTEXT **)0x0) break;
          aom_free(above_contexts->entropy[uVar2][lVar3]);
          above_contexts->entropy[uVar2][lVar3] = (ENTROPY_CONTEXT *)0x0;
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      if (above_contexts->partition != (PARTITION_CONTEXT **)0x0) {
        aom_free(above_contexts->partition[lVar3]);
        above_contexts->partition[lVar3] = (PARTITION_CONTEXT *)0x0;
      }
      if (above_contexts->txfm != (TXFM_CONTEXT **)0x0) {
        aom_free(above_contexts->txfm[lVar3]);
        above_contexts->txfm[lVar3] = (TXFM_CONTEXT *)0x0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < above_contexts->num_tile_rows);
  }
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      aom_free(above_contexts->entropy[uVar2]);
      above_contexts->entropy[uVar2] = (ENTROPY_CONTEXT **)0x0;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  aom_free(above_contexts->partition);
  above_contexts->partition = (PARTITION_CONTEXT **)0x0;
  aom_free(above_contexts->txfm);
  above_contexts->txfm = (TXFM_CONTEXT **)0x0;
  above_contexts->num_planes = 0;
  above_contexts->num_tile_rows = 0;
  above_contexts->num_mi_cols = 0;
  return;
}

Assistant:

void av1_free_above_context_buffers(CommonContexts *above_contexts) {
  int i;
  const int num_planes = above_contexts->num_planes;

  for (int tile_row = 0; tile_row < above_contexts->num_tile_rows; tile_row++) {
    for (i = 0; i < num_planes; i++) {
      if (above_contexts->entropy[i] == NULL) break;
      aom_free(above_contexts->entropy[i][tile_row]);
      above_contexts->entropy[i][tile_row] = NULL;
    }
    if (above_contexts->partition != NULL) {
      aom_free(above_contexts->partition[tile_row]);
      above_contexts->partition[tile_row] = NULL;
    }

    if (above_contexts->txfm != NULL) {
      aom_free(above_contexts->txfm[tile_row]);
      above_contexts->txfm[tile_row] = NULL;
    }
  }
  for (i = 0; i < num_planes; i++) {
    aom_free(above_contexts->entropy[i]);
    above_contexts->entropy[i] = NULL;
  }
  aom_free(above_contexts->partition);
  above_contexts->partition = NULL;

  aom_free(above_contexts->txfm);
  above_contexts->txfm = NULL;

  above_contexts->num_tile_rows = 0;
  above_contexts->num_mi_cols = 0;
  above_contexts->num_planes = 0;
}